

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_oo(void)

{
  clock_t cVar1;
  clock_t cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  dsfmt_t dsfmt;
  dsfmt_t dStack_c38;
  
  dsfmt_chk_init_gen_rand(&dStack_c38,0x4d2,0x4de1);
  lVar4 = 0;
  for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
    iVar5 = 2000;
    cVar1 = clock();
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      dsfmt_fill_array_open_open(&dStack_c38,dummy[0].d,50000);
    }
    cVar2 = clock();
    lVar4 = (lVar4 - cVar1) + cVar2;
  }
  printf("ST BLOCK (0, 1) AVE:%4lums.\n",(ulong)(lVar4 * 100) / 1000000,
         (ulong)(lVar4 * 100) % 1000000);
  return;
}

Assistant:

static void test_oo(void) {
    uint32_t i, j;
    uint64_t clo;
    uint64_t sum;
    double *array = (double *)dummy;
    dsfmt_t dsfmt;
#if 0
    dsfmt_gv_init_gen_rand(1234);
    sum = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    dsfmt_gv_fill_array_open_open(array, NUM_RANDS);
	}
	clo = clock() - clo;
	sum += clo;
    }
    printf("GL BLOCK (0, 1) AVE:%4" PRIu64"ms.\n",
	   (sum * 100) / CLOCKS_PER_SEC);
#endif
    dsfmt_init_gen_rand(&dsfmt, 1234);
    sum = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            dsfmt_fill_array_open_open(&dsfmt, array, NUM_RANDS);
        }
        clo = clock() - clo;
        sum += clo;
    }
    printf("ST BLOCK (0, 1) AVE:%4" PRIu64"ms.\n",
           (sum * 100) / CLOCKS_PER_SEC);
}